

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

void __thiscall ncnn::NetPrivate::update_input_output_indexes(NetPrivate *this)

{
  pointer piVar1;
  pointer ppLVar2;
  Layer *pLVar3;
  pointer pBVar4;
  undefined8 in_RAX;
  long lVar5;
  size_t i;
  ulong uVar6;
  int local_38;
  int blob_index;
  
  piVar1 = (this->input_blob_indexes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->input_blob_indexes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar1) {
    (this->input_blob_indexes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar1;
  }
  piVar1 = (this->output_blob_indexes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->output_blob_indexes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar1) {
    (this->output_blob_indexes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar1;
  }
  _local_38 = in_RAX;
  for (uVar6 = 0;
      ppLVar2 = (this->layers).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
                _M_impl.super__Vector_impl_data._M_start,
      uVar6 < (ulong)((long)(this->layers).
                            super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)ppLVar2 >> 3);
      uVar6 = uVar6 + 1) {
    pLVar3 = ppLVar2[uVar6];
    if (pLVar3->typeindex == 0x10) {
      _local_38 = CONCAT44(*(pLVar3->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start,local_38);
      std::vector<int,_std::allocator<int>_>::push_back(&this->input_blob_indexes,&blob_index);
    }
  }
  lVar5 = 0x24;
  for (uVar6 = 0;
      pBVar4 = (this->blobs).super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
               super__Vector_impl_data._M_start,
      uVar6 < (ulong)(((long)(this->blobs).
                             super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
                             super__Vector_impl_data._M_finish - (long)pBVar4) / 0x70);
      uVar6 = uVar6 + 1) {
    if ((*(int *)((long)pBVar4 + lVar5 + -4) != -1) &&
       (*(int *)((long)&(pBVar4->name)._M_dataplus._M_p + lVar5) == -1)) {
      _local_38 = CONCAT44(blob_index,(int)uVar6);
      std::vector<int,_std::allocator<int>_>::emplace_back<int>
                (&this->output_blob_indexes,&stack0xffffffffffffffc8);
    }
    lVar5 = lVar5 + 0x70;
  }
  return;
}

Assistant:

void NetPrivate::update_input_output_indexes()
{
    input_blob_indexes.clear();
    output_blob_indexes.clear();

    for (size_t i = 0; i < layers.size(); i++)
    {
        if (layers[i]->typeindex == LayerType::Input)
        {
            int blob_index = layers[i]->tops[0];
            input_blob_indexes.push_back(blob_index);
        }
    }

    for (size_t i = 0; i < blobs.size(); i++)
    {
        if (blobs[i].producer != -1 && blobs[i].consumer == -1)
        {
            output_blob_indexes.push_back(i);
        }
    }
}